

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapRead.c
# Opt level: O0

int Amap_ParseCountPins(Vec_Ptr_t *vTokens,int iPos)

{
  int iVar1;
  char *__s1;
  int local_30;
  int local_2c;
  int Counter;
  int i;
  char *pToken;
  int iPos_local;
  Vec_Ptr_t *vTokens_local;
  
  local_30 = 0;
  local_2c = iPos;
  do {
    iVar1 = Vec_PtrSize(vTokens);
    if (iVar1 <= local_2c) {
      return local_30;
    }
    __s1 = (char *)Vec_PtrEntry(vTokens,local_2c);
    iVar1 = strcmp(__s1,"PIN");
    if (iVar1 == 0) {
      local_30 = local_30 + 1;
    }
    else {
      iVar1 = strcmp(__s1,"GATE");
      if (iVar1 == 0) {
        return local_30;
      }
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

int Amap_ParseCountPins( Vec_Ptr_t * vTokens, int iPos )
{
    char * pToken;
    int i, Counter = 0;
    Vec_PtrForEachEntryStart( char *, vTokens, pToken, i, iPos )
        if ( !strcmp( pToken, AMAP_STRING_PIN ) )
            Counter++;
        else if ( !strcmp( pToken, AMAP_STRING_GATE ) )
            return Counter;
    return Counter;
}